

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDrawTests.cpp
# Opt level: O2

void deqp::gles2::Functional::anon_unknown_0::addTestIterations
               (DrawTest *test,DrawTestSpec *baseSpec,TestIterationType type)

{
  DrawTestSpec spec;
  DrawTestSpec local_60;
  
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_60,baseSpec);
  local_60.primitiveCount = 1;
  deqp::gls::DrawTest::addIteration(test,&local_60,"draw count = 1");
  local_60.primitiveCount = 5;
  deqp::gls::DrawTest::addIteration(test,&local_60,"draw count = 5");
  local_60.primitiveCount = 0x19;
  deqp::gls::DrawTest::addIteration(test,&local_60,"draw count = 25");
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&local_60.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  return;
}

Assistant:

static void addTestIterations (gls::DrawTest* test, const gls::DrawTestSpec& baseSpec, TestIterationType type)
{
	gls::DrawTestSpec spec(baseSpec);

	if (type == TYPE_DRAW_COUNT)
	{
		spec.primitiveCount = 1;
		test->addIteration(spec, "draw count = 1");

		spec.primitiveCount = 5;
		test->addIteration(spec, "draw count = 5");

		spec.primitiveCount = 25;
		test->addIteration(spec, "draw count = 25");
	}
	else
		DE_ASSERT(false);
}